

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_DICEPS.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  time_t tVar2;
  DICEPSPlanner *this;
  undefined8 in_RSI;
  undefined4 in_EDI;
  E *e;
  double V;
  Index restartI;
  DICEPSPlanner *planner;
  PlanningUnitMADPDiscreteParameters params;
  DecPOMDPDiscreteInterface *decpomdp;
  Timing Time;
  int horizon;
  Arguments args;
  allocator<char> *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  allocator<char> *__s;
  Arguments *in_stack_fffffffffffffbc0;
  allocator<char> local_3b1;
  string local_3b0 [32];
  shared_ptr<JointPolicyPureVector> local_390 [16];
  double local_380;
  allocator<char> local_371;
  string local_370 [39];
  allocator<char> local_349;
  string local_348 [32];
  uint local_328;
  allocator<char> local_321;
  string local_320 [32];
  DICEPSPlanner *local_300;
  PlanningUnitMADPDiscreteParameters local_2f2 [9];
  allocator<char> local_2e9;
  string local_2e8 [32];
  DecPOMDPDiscreteInterface *local_2c8;
  allocator<char> local_2b9;
  string local_2b8 [32];
  Timing local_298 [56];
  int local_260;
  Arguments local_250;
  undefined8 local_18;
  undefined4 local_10;
  int local_c;
  
  local_c = 0;
  local_18 = in_RSI;
  local_10 = in_EDI;
  ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffffbc0);
  argp_parse(ArgumentHandlers::theArgpStruc,local_10,local_18,0,0,&local_250);
  if (-1 < local_250.verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"DICE: direct CE Policy Search");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  local_260 = local_250.horizon;
  if (0 < local_250.verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Horizon = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_260);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  Timing::Timing(local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  Timing::Start((string *)local_298);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  local_2c8 = (DecPOMDPDiscreteInterface *)
              ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&local_250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  Timing::Start((string *)local_298);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_2f2);
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_2f2,0));
  PlanningUnitMADPDiscreteParameters::SetComputeJointActionObservationHistories(local_2f2,false);
  PlanningUnitMADPDiscreteParameters::SetComputeJointActionHistories(local_2f2,false);
  PlanningUnitMADPDiscreteParameters::SetComputeIndividualActionObservationHistories
            (local_2f2,false);
  PlanningUnitMADPDiscreteParameters::SetComputeIndividualActionHistories(local_2f2,false);
  PlanningUnitMADPDiscreteParameters::SetComputeJointObservationHistories(local_2f2,true);
  PlanningUnitMADPDiscreteParameters::SetComputeJointBeliefs(local_2f2,false);
  if (local_250.sparse == 0) {
    PlanningUnitMADPDiscreteParameters::SetUseSparseJointBeliefs(local_2f2,false);
  }
  else {
    PlanningUnitMADPDiscreteParameters::SetUseSparseJointBeliefs(local_2f2,true);
  }
  this = (DICEPSPlanner *)operator_new(0x3b0);
  DICEPSPlanner::DICEPSPlanner
            (this,(long)local_260,local_2c8,1,local_250.nrCEIterations,local_250.nrCESamples,
             local_250.nrCESamplesForUpdate,(bool)(local_250.CE_use_hard_threshold & 1),
             local_250.CE_alpha,local_250.nrCEEvaluationRuns,local_2f2,false,(ofstream *)0x0,
             local_250.verbose);
  local_300 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  Timing::Stop((string *)local_298);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  if (-1 < local_250.verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"DICEPSPlanner initialized");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (local_328 = 0; local_328 < local_250.nrCERestarts; local_328 = local_328 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    Timing::Start((string *)local_298);
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator(&local_349);
    (**(code **)(*(long *)local_300 + 0x18))();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    Timing::Stop((string *)local_298);
    std::__cxx11::string::~string(local_370);
    std::allocator<char>::~allocator(&local_371);
    local_380 = (double)(**(code **)(*(long *)local_300 + 0x98))();
    poVar1 = std::operator<<((ostream *)&std::cout,"value=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_380);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    if (0 < local_250.verbose) {
      (**(code **)(*(long *)local_300 + 0xa0))(local_390);
      in_stack_fffffffffffffbc0 =
           (Arguments *)boost::shared_ptr<JointPolicyPureVector>::operator->(local_390);
      (**(code **)(*(long *)in_stack_fffffffffffffbc0 + 0x38))();
      boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                ((shared_ptr<JointPolicyPureVector> *)0x104779);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  __s = &local_3b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc0,(char *)__s,in_stack_fffffffffffffbb0);
  Timing::Stop((string *)local_298);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  if (-1 < local_250.verbose) {
    Timing::PrintSummary();
    TimedAlgorithm::PrintTimersSummary();
  }
  if (local_300 != (DICEPSPlanner *)0x0) {
    (**(code **)(*(long *)local_300 + 8))();
  }
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_2f2);
  Timing::~Timing(local_298);
  ArgumentHandlers::Arguments::~Arguments((Arguments *)0x1049d6);
  return local_c;
}

Assistant:

int main(int argc, char **argv)
{
    // parse the command line arguments
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    if(args.verbose >= 0)
        cout << "DICE: direct CE Policy Search"<<endl;

    srand(time(0));

    int horizon = args.horizon;
    if(args.verbose >= 1)
        cout << "Horizon = " << horizon << endl;

    try {
    //start timers
    Timing Time;    
    Time.Start("Overall");

    DecPOMDPDiscreteInterface & decpomdp = * GetDecPOMDPDiscreteInterfaceFromArgs(args);
    
    //Initialization of the planner with typical options for JESP:
    Time.Start("PlanningUnit");
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    params.SetComputeJointActionObservationHistories(false);
    params.SetComputeJointActionHistories(false);
    params.SetComputeIndividualActionObservationHistories(false);
    params.SetComputeIndividualActionHistories(false);
    //params.SetComputeIndividualObservationHistories(false);
    // joint observations histories are needed for
    // efficient computation of joint actions
    params.SetComputeJointObservationHistories(true);
    params.SetComputeJointBeliefs(false);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);
    DICEPSPlanner* planner;
    planner = new DICEPSPlanner (
        horizon,
        &decpomdp,
        //CE params
        1, // the restarts loop is executed here, not in DICEPSPlanner
        args.nrCEIterations,
        args.nrCESamples,
        args.nrCESamplesForUpdate, 
        args.CE_use_hard_threshold, //(gamma in CE papers)
        args.CE_alpha, //the learning rate
        args.nrCEEvaluationRuns, //the number of evaluation runs
        &params, false, 0, args.verbose
    );
    Time.Stop("PlanningUnit");
    if(args.verbose >= 0)
        cout << "DICEPSPlanner initialized" << endl;

    for(Index restartI = 0; restartI < args.nrCERestarts; restartI++)
    {
        Time.Start("Plan");
        planner->Plan();
        Time.Stop("Plan");

        double V = planner->GetExpectedReward();
        cout << "value="<< V << endl;
        if(args.verbose >= 1)
        {
            planner->GetJointPolicyPureVector()->Print();
            cout <<  endl;
        }
    }
    /* clean up */

    Time.Stop("Overall");

    if(args.verbose >= 0)
    {
        Time.PrintSummary();
        planner->PrintTimersSummary();
    }

    delete planner;
    }
    catch(E& e){ e.Print(); }
}